

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O1

QDebug __thiscall
QtPrivate::printSequentialContainer<QList<Qt::DayOfWeek>>
          (QtPrivate *this,QDebug debug,char *which,QList<Qt::DayOfWeek> *c)

{
  char *pcVar1;
  QTextStream *pQVar2;
  DayOfWeek *pDVar3;
  long lVar4;
  _func_int **pp_Var5;
  QString *pQVar6;
  undefined1 *puVar7;
  DayOfWeek *pDVar8;
  QString *this_00;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QDebugStateSaver saver;
  QDebug local_78;
  QDebug local_70;
  QDebug local_68;
  QDebug local_60;
  QDebugStateSaver local_58;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  puVar7 = (undefined1 *)c;
  QDebugStateSaver::QDebugStateSaver(&local_58,(QDebug *)debug.stream);
  pQVar2 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
  *(undefined1 *)&pQVar2[3]._vptr_QTextStream = 0;
  if (which == (char *)0x0) {
    this_00 = (QString *)0x0;
  }
  else {
    pQVar6 = (QString *)0xffffffffffffffff;
    do {
      this_00 = (QString *)((long)&(pQVar6->d).d + 1);
      pcVar1 = which + 1 + (long)pQVar6;
      pQVar6 = this_00;
    } while (*pcVar1 != '\0');
  }
  ba.m_data = puVar7;
  ba.m_size = (qsizetype)which;
  QString::fromUtf8(&local_50,this_00,ba);
  ::QTextStream::operator<<(pQVar2,&local_50);
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar2 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
  if (*(char *)&pQVar2[3]._vptr_QTextStream == '\x01') {
    ::QTextStream::operator<<(pQVar2,' ');
  }
  ::QTextStream::operator<<((QTextStream *)((debug.stream)->ts)._vptr_QTextStream,'(');
  pQVar2 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
  if (*(char *)&pQVar2[3]._vptr_QTextStream == '\x01') {
    ::QTextStream::operator<<(pQVar2,' ');
  }
  pDVar3 = (c->d).ptr;
  lVar4 = (c->d).size;
  pDVar8 = pDVar3;
  if (lVar4 != 0) {
    local_68.stream = (Stream *)((debug.stream)->ts)._vptr_QTextStream;
    (local_68.stream)->ref = (local_68.stream)->ref + 1;
    puVar7 = Qt::staticMetaObject;
    qt_QMetaEnum_debugOperator
              (&local_60,(qint64)&local_68,(QMetaObject *)(ulong)*pDVar3,Qt::staticMetaObject);
    QDebug::~QDebug(&local_60);
    QDebug::~QDebug(&local_68);
    pDVar8 = pDVar3 + 1;
  }
  if (pDVar8 != pDVar3 + lVar4) {
    do {
      pQVar2 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
      ba_00.m_data = puVar7;
      ba_00.m_size = (qsizetype)", ";
      QString::fromUtf8(&local_50,(QString *)0x2,ba_00);
      ::QTextStream::operator<<(pQVar2,&local_50);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      pQVar2 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
      if (*(char *)&pQVar2[3]._vptr_QTextStream == '\x01') {
        ::QTextStream::operator<<(pQVar2,' ');
      }
      local_78.stream = (Stream *)((debug.stream)->ts)._vptr_QTextStream;
      (local_78.stream)->ref = (local_78.stream)->ref + 1;
      puVar7 = Qt::staticMetaObject;
      qt_QMetaEnum_debugOperator
                (&local_70,(qint64)&local_78,(QMetaObject *)(ulong)*pDVar8,Qt::staticMetaObject);
      QDebug::~QDebug(&local_70);
      QDebug::~QDebug(&local_78);
      pDVar8 = pDVar8 + 1;
    } while (pDVar8 != pDVar3 + lVar4);
  }
  ::QTextStream::operator<<((QTextStream *)((debug.stream)->ts)._vptr_QTextStream,')');
  pQVar2 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
  if (*(char *)&pQVar2[3]._vptr_QTextStream == '\x01') {
    ::QTextStream::operator<<(pQVar2,' ');
  }
  pp_Var5 = ((debug.stream)->ts)._vptr_QTextStream;
  ((debug.stream)->ts)._vptr_QTextStream = (_func_int **)0x0;
  *(_func_int ***)this = pp_Var5;
  QDebugStateSaver::~QDebugStateSaver(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QDebug)(Stream *)this;
}

Assistant:

inline QDebug printSequentialContainer(QDebug debug, const char *which, const SequentialContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << '(';
    typename SequentialContainer::const_iterator it = c.begin(), end = c.end();
    if (it != end) {
        debug << *it;
        ++it;
    }
    while (it != end) {
        debug << ", " << *it;
        ++it;
    }
    debug << ')';
    return debug;
}